

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.h
# Opt level: O1

void __thiscall
kj::Lazy<unsigned_int>::
InitImpl<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/mutex-test.c++:197:3)>
::run(InitImpl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_mutex_test_c__:197:3)>
      *this)

{
  Lazy<unsigned_int> *pLVar1;
  Disposer *pDVar2;
  uint *puVar3;
  
  pLVar1 = this->lazy;
  (pLVar1->space).field_0.value = 0x315;
  pDVar2 = (pLVar1->value).disposer;
  puVar3 = (pLVar1->value).ptr;
  (pLVar1->value).disposer = (Disposer *)&DestructorOnlyDisposer<unsigned_int>::instance;
  (pLVar1->value).ptr = (uint *)&pLVar1->space;
  if (puVar3 != (uint *)0x0) {
    (**pDVar2->_vptr_Disposer)();
    return;
  }
  return;
}

Assistant:

void run() override {
    lazy.value = func(lazy.space);
  }